

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

curl_socket_t Curl_getconnectinfo(Curl_easy *data,connectdata **connp)

{
  Curl_multi *pCVar1;
  Curl_share *pCVar2;
  curl_socket_t cVar3;
  conncache *connc;
  connfind find;
  long local_28;
  connectdata *local_20;
  
  local_28 = (data->state).lastconnect_id;
  cVar3 = -1;
  if (local_28 != -1) {
    pCVar1 = data->multi_easy;
    if ((pCVar1 != (Curl_multi *)0x0) || (data->multi != (Curl_multi *)0x0)) {
      local_20 = (connectdata *)0x0;
      pCVar2 = data->share;
      if ((pCVar2 == (Curl_share *)0x0) || ((pCVar2->specifier & 0x20) == 0)) {
        if (pCVar1 == (Curl_multi *)0x0) {
          connc = &data->multi->conn_cache;
        }
        else {
          connc = &pCVar1->conn_cache;
        }
      }
      else {
        connc = &pCVar2->conn_cache;
      }
      Curl_conncache_foreach(data,connc,&local_28,conn_is_conn);
      if (local_20 == (connectdata *)0x0) {
        (data->state).lastconnect_id = -1;
        cVar3 = -1;
      }
      else {
        if (connp != (connectdata **)0x0) {
          *connp = local_20;
        }
        cVar3 = local_20->sock[0];
      }
    }
  }
  return cVar3;
}

Assistant:

curl_socket_t Curl_getconnectinfo(struct Curl_easy *data,
                                  struct connectdata **connp)
{
  DEBUGASSERT(data);

  /* this works for an easy handle:
   * - that has been used for curl_easy_perform()
   * - that is associated with a multi handle, and whose connection
   *   was detached with CURLOPT_CONNECT_ONLY
   */
  if((data->state.lastconnect_id != -1) && (data->multi_easy || data->multi)) {
    struct connectdata *c;
    struct connfind find;
    find.id_tofind = data->state.lastconnect_id;
    find.found = NULL;

    Curl_conncache_foreach(data,
                           data->share && (data->share->specifier
                           & (1<< CURL_LOCK_DATA_CONNECT))?
                           &data->share->conn_cache:
                           data->multi_easy?
                           &data->multi_easy->conn_cache:
                           &data->multi->conn_cache, &find, conn_is_conn);

    if(!find.found) {
      data->state.lastconnect_id = -1;
      return CURL_SOCKET_BAD;
    }

    c = find.found;
    if(connp)
      /* only store this if the caller cares for it */
      *connp = c;
    return c->sock[FIRSTSOCKET];
  }
  return CURL_SOCKET_BAD;
}